

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Value.cpp
# Opt level: O0

void __thiscall luna::Value::Accept(Value *this,GCObjectVisitor *v)

{
  _func_int **pp_Var1;
  undefined8 in_RSI;
  UserData *in_RDI;
  GCObjectVisitor *in_stack_ffffffffffffffd8;
  
  switch(*(undefined4 *)&(in_RDI->super_GCObject).next_) {
  case 0:
  case 1:
  case 2:
  case 9:
    break;
  case 3:
    pp_Var1 = (in_RDI->super_GCObject)._vptr_GCObject;
    (**(code **)(*pp_Var1 + 0x10))(pp_Var1,in_RSI);
    break;
  case 4:
    pp_Var1 = (in_RDI->super_GCObject)._vptr_GCObject;
    (**(code **)(*pp_Var1 + 0x10))(pp_Var1,in_RSI);
    break;
  case 5:
    pp_Var1 = (in_RDI->super_GCObject)._vptr_GCObject;
    (**(code **)(*pp_Var1 + 0x10))(pp_Var1,in_RSI);
    break;
  case 6:
    pp_Var1 = (in_RDI->super_GCObject)._vptr_GCObject;
    (**(code **)(*pp_Var1 + 0x10))(pp_Var1,in_RSI);
    break;
  case 7:
    pp_Var1 = (in_RDI->super_GCObject)._vptr_GCObject;
    (**(code **)(*pp_Var1 + 0x10))(pp_Var1,in_RSI);
    break;
  case 8:
    UserData::Accept(in_RDI,in_stack_ffffffffffffffd8);
  }
  return;
}

Assistant:

void Value::Accept(GCObjectVisitor *v) const
    {
        switch (type_)
        {
            case ValueT_Nil:
            case ValueT_Bool:
            case ValueT_Number:
            case ValueT_CFunction:
                break;
            case ValueT_Obj:
                obj_->Accept(v);
                break;
            case ValueT_String:
                str_->Accept(v);
                break;
            case ValueT_Closure:
                closure_->Accept(v);
                break;
            case ValueT_Upvalue:
                upvalue_->Accept(v);
                break;
            case ValueT_Table:
                table_->Accept(v);
                break;
            case ValueT_UserData:
                user_data_->Accept(v);
                break;
        }
    }